

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aes.c
# Opt level: O0

int aesni_init_key(EVP_CIPHER_CTX *ctx,uchar *key,uchar *iv,int enc)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  int in_ECX;
  code *pcVar4;
  char *in_RSI;
  EVP_CIPHER_CTX *in_RDI;
  EVP_AES_KEY *dat;
  int mode;
  int ret;
  EVP_CIPHER_CTX *in_stack_00000050;
  char *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  int local_28;
  uint local_4;
  
  pvVar3 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  EVP_CIPHER_CTX_get0_cipher(in_RDI);
  iVar1 = EVP_CIPHER_get_mode((EVP_CIPHER *)0x25b648);
  if (((iVar1 == 1) || (iVar1 == 2)) && (in_ECX == 0)) {
    iVar2 = EVP_CIPHER_CTX_get_key_length(in_stack_00000050);
    local_28 = aesni_set_decrypt_key(in_RSI,iVar2 << 3,pvVar3);
    *(code **)((long)pvVar3 + 0xf8) = aesni_decrypt;
    pcVar4 = (code *)0x0;
    if (iVar1 == 2) {
      pcVar4 = aesni_cbc_encrypt;
    }
    *(code **)((long)pvVar3 + 0x100) = pcVar4;
    in_stack_ffffffffffffffc0 = in_RSI;
  }
  else {
    iVar2 = EVP_CIPHER_CTX_get_key_length(in_stack_00000050);
    local_28 = aesni_set_encrypt_key(in_RSI,iVar2 << 3,pvVar3);
    *(code **)((long)pvVar3 + 0xf8) = aesni_encrypt;
    if (iVar1 == 2) {
      *(code **)((long)pvVar3 + 0x100) = aesni_cbc_encrypt;
    }
    else if (iVar1 == 5) {
      *(code **)((long)pvVar3 + 0x100) = aesni_ctr32_encrypt_blocks;
    }
    else {
      *(undefined8 *)((long)pvVar3 + 0x100) = 0;
    }
  }
  iVar2 = (int)((ulong)pvVar3 >> 0x20);
  if (-1 >= local_28) {
    ERR_new();
    ERR_set_debug((char *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),iVar2,in_stack_ffffffffffffffc0)
    ;
    ERR_set_error(6,0x8f,(char *)0x0);
  }
  local_4 = (uint)(-1 < local_28);
  return local_4;
}

Assistant:

static int aesni_init_key(EVP_CIPHER_CTX *ctx, const unsigned char *key,
                          const unsigned char *iv, int enc)
{
    int ret, mode;
    EVP_AES_KEY *dat = EVP_C_DATA(EVP_AES_KEY,ctx);

    mode = EVP_CIPHER_CTX_get_mode(ctx);
    if ((mode == EVP_CIPH_ECB_MODE || mode == EVP_CIPH_CBC_MODE)
        && !enc) {
        ret = aesni_set_decrypt_key(key,
                                    EVP_CIPHER_CTX_get_key_length(ctx) * 8,
                                    &dat->ks.ks);
        dat->block = (block128_f) aesni_decrypt;
        dat->stream.cbc = mode == EVP_CIPH_CBC_MODE ?
            (cbc128_f) aesni_cbc_encrypt : NULL;
    } else {
        ret = aesni_set_encrypt_key(key,
                                    EVP_CIPHER_CTX_get_key_length(ctx) * 8,
                                    &dat->ks.ks);
        dat->block = (block128_f) aesni_encrypt;
        if (mode == EVP_CIPH_CBC_MODE)
            dat->stream.cbc = (cbc128_f) aesni_cbc_encrypt;
        else if (mode == EVP_CIPH_CTR_MODE)
            dat->stream.ctr = (ctr128_f) aesni_ctr32_encrypt_blocks;
        else
            dat->stream.cbc = NULL;
    }

    if (ret < 0) {
        ERR_raise(ERR_LIB_EVP, EVP_R_AES_KEY_SETUP_FAILED);
        return 0;
    }

    return 1;
}